

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutlineHandler.cpp
# Opt level: O0

void __thiscall
OutlineHandler::run(OutlineHandler *this,Id *id,
                   optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                   *paramsOpt)

{
  bool bVar1;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  Type this_01;
  Ch *__s;
  File *file_00;
  reference this_02;
  DocumentSymbol *symbol;
  iterator __end1;
  iterator __begin1;
  vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *__range1;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 local_130 [8];
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  writer;
  StringBuffer buffer;
  vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> local_a8;
  undefined1 local_90 [8];
  vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> symbols;
  File *file;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string uri;
  Value *textDocumentIdentifier;
  Value *params;
  optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  *paramsOpt_local;
  Id *id_local;
  OutlineHandler *this_local;
  
  bVar1 = ::optional::operator_cast_to_bool((optional *)paramsOpt);
  if (!bVar1) {
    sendError(id,InvalidParams,"missing params",(Value *)0x0);
    return;
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
               ::operator*(paramsOpt);
  uri.field_2._8_8_ =
       rapidjson::
       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
       operator[]<char_const>(this_00,"textDocument");
  this_01 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)uri.field_2._8_8_,"uri");
  __s = rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString(this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_51);
  std::allocator<char>::~allocator(&local_51);
  file_00 = FileManager::get((string *)local_50);
  if (file_00 == (File *)0x0) {
    std::operator<<((ostream *)&std::cerr,"!!! Null file !!!\n");
    sendNullResult(id);
    symbols.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    goto LAB_00222744;
  }
  std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::vector
            ((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)local_90);
  if (file_00->type == Tex) {
    getOutlineForLatexFile(&local_a8,file_00);
    std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::operator=
              ((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)local_90,&local_a8);
    std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::~vector(&local_a8);
LAB_0022254c:
    rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    GenericStringBuffer((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                        &writer.maxDecimalPlaces_,(CrtAllocator *)0x0,0x100);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Writer((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *)local_130,
             (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
             &writer.maxDecimalPlaces_,(CrtAllocator *)0x0,0x20);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartObject((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                   *)local_130);
    local_138 = "jsonrpc";
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Key((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           *)local_130,&local_138);
    local_140 = "2.0";
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *)local_130,&local_140);
    local_148 = "id";
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Key((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           *)local_130,&local_148);
    Id::writeId(id,(StringWriter *)local_130);
    __range1 = (vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)0x27a402;
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Key((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           *)local_130,(Ch **)&__range1);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartArray((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                  *)local_130);
    __end1 = std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::begin
                       ((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)local_90);
    symbol = (DocumentSymbol *)
             std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::end
                       ((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)local_90);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<DocumentSymbol_*,_std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>_>
                                       *)&symbol), bVar1) {
      this_02 = __gnu_cxx::
                __normal_iterator<DocumentSymbol_*,_std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>_>
                ::operator*(&__end1);
      DocumentSymbol::reflect((DocumentSymbol *)this_02,(StringWriter *)local_130);
      __gnu_cxx::
      __normal_iterator<DocumentSymbol_*,_std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>_>
      ::operator++(&__end1);
    }
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndArray((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                *)local_130,0);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndObject((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 *)local_130,0);
    sendMessage((StringBuffer *)&writer.maxDecimalPlaces_);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::~Writer((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
               *)local_130);
    rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    ~GenericStringBuffer
              ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
               &writer.maxDecimalPlaces_);
    symbols.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  else {
    if (file_00->type == Bib) {
      getOutlineForBibFile
                ((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)
                 &buffer.stack_.initialCapacity_,file_00);
      std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::operator=
                ((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)local_90,
                 (vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)
                 &buffer.stack_.initialCapacity_);
      std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::~vector
                ((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)
                 &buffer.stack_.initialCapacity_);
      goto LAB_0022254c;
    }
    sendNullResult(id);
    symbols.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::~vector
            ((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)local_90);
LAB_00222744:
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void OutlineHandler::run (Id &id, optional<Value> &paramsOpt) {
    if (!paramsOpt) {
        sendError(&id, ResponseHandler::ErrorCode::InvalidParams, "missing params");
        return;
    }

    Value &params = *paramsOpt; // TODO: Make function

    Value &textDocumentIdentifier = params["textDocument"];
    string uri = textDocumentIdentifier["uri"].GetString();

    File *file = FileManager::get(uri);
    if (file == nullptr) {
        std::cerr << "!!! Null file !!!\n";
        sendNullResult(id);
        return;
    }

    vector<DocumentSymbol> symbols;
    switch (file->type) {
        case File::Type::Tex:
            symbols = getOutlineForLatexFile(*file);
            break;
        case File::Type::Bib:
            symbols = getOutlineForBibFile(*file);
            break;
        default:
            sendNullResult(id);
            return;
    }

    INIT_WRITER
    ADD_ID(id);
    writer.Key("result");
    writer.StartArray();
    for (auto &symbol : symbols) {
        symbol.reflect(writer);
    }
    writer.EndArray();
    SEND_MESSAGE
}